

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O1

map_node_t ** map_getref(map_base_t *m,char *key)

{
  map_node_t **ppmVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  uint uVar6;
  map_node_t **ppmVar7;
  map_node_t *pmVar8;
  
  cVar2 = *key;
  if (cVar2 == '\0') {
    uVar6 = 0x1505;
  }
  else {
    pcVar5 = key + 1;
    uVar6 = 0x1505;
    do {
      uVar6 = (int)cVar2 ^ uVar6 * 0x21;
      cVar2 = *pcVar5;
      pcVar5 = pcVar5 + 1;
    } while (cVar2 != '\0');
  }
  if (m->nbuckets != 0) {
    uVar4 = m->nbuckets - 1 & uVar6;
    pmVar8 = m->buckets[(int)uVar4];
    if (pmVar8 != (map_node_t *)0x0) {
      ppmVar7 = m->buckets + (int)uVar4;
      do {
        if ((pmVar8->hash == uVar6) && (iVar3 = strcmp((char *)(pmVar8 + 1),key), iVar3 == 0)) {
          return ppmVar7;
        }
        ppmVar1 = &pmVar8->next;
        ppmVar7 = &pmVar8->next;
        pmVar8 = *ppmVar1;
      } while (*ppmVar1 != (map_node_t *)0x0);
    }
  }
  return (map_node_t **)0x0;
}

Assistant:

static map_node_t **map_getref(map_base_t *m, const char *key) {
  unsigned hash = map_hash(key);
  map_node_t **next;
  if (m->nbuckets > 0) {
    next = &m->buckets[map_bucketidx(m, hash)];
    while (*next) {
      if ((*next)->hash == hash && !strcmp((char*) (*next + 1), key)) {
        return next;
      }
      next = &(*next)->next;
    }
  }
  return NULL;
}